

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log.c
# Opt level: O1

int test_log(void)

{
  char *__s;
  int i;
  uint uVar1;
  char cwd [128];
  char logfile [256];
  char local_198 [384];
  
  local_198[0] = '\0';
  local_198[1] = '\0';
  local_198[2] = '\0';
  local_198[3] = '\0';
  local_198[4] = '\0';
  local_198[5] = '\0';
  local_198[6] = '\0';
  local_198[7] = '\0';
  local_198[8] = '\0';
  local_198[9] = '\0';
  local_198[10] = '\0';
  local_198[0xb] = '\0';
  local_198[0xc] = '\0';
  local_198[0xd] = '\0';
  local_198[0xe] = '\0';
  local_198[0xf] = '\0';
  local_198[0x10] = '\0';
  local_198[0x11] = '\0';
  local_198[0x12] = '\0';
  local_198[0x13] = '\0';
  local_198[0x14] = '\0';
  local_198[0x15] = '\0';
  local_198[0x16] = '\0';
  local_198[0x17] = '\0';
  local_198[0x18] = '\0';
  local_198[0x19] = '\0';
  local_198[0x1a] = '\0';
  local_198[0x1b] = '\0';
  local_198[0x1c] = '\0';
  local_198[0x1d] = '\0';
  local_198[0x1e] = '\0';
  local_198[0x1f] = '\0';
  local_198[0x20] = '\0';
  local_198[0x21] = '\0';
  local_198[0x22] = '\0';
  local_198[0x23] = '\0';
  local_198[0x24] = '\0';
  local_198[0x25] = '\0';
  local_198[0x26] = '\0';
  local_198[0x27] = '\0';
  local_198[0x28] = '\0';
  local_198[0x29] = '\0';
  local_198[0x2a] = '\0';
  local_198[0x2b] = '\0';
  local_198[0x2c] = '\0';
  local_198[0x2d] = '\0';
  local_198[0x2e] = '\0';
  local_198[0x2f] = '\0';
  local_198[0x30] = '\0';
  local_198[0x31] = '\0';
  local_198[0x32] = '\0';
  local_198[0x33] = '\0';
  local_198[0x34] = '\0';
  local_198[0x35] = '\0';
  local_198[0x36] = '\0';
  local_198[0x37] = '\0';
  local_198[0x38] = '\0';
  local_198[0x39] = '\0';
  local_198[0x3a] = '\0';
  local_198[0x3b] = '\0';
  local_198[0x3c] = '\0';
  local_198[0x3d] = '\0';
  local_198[0x3e] = '\0';
  local_198[0x3f] = '\0';
  local_198[0x40] = '\0';
  local_198[0x41] = '\0';
  local_198[0x42] = '\0';
  local_198[0x43] = '\0';
  local_198[0x44] = '\0';
  local_198[0x45] = '\0';
  local_198[0x46] = '\0';
  local_198[0x47] = '\0';
  local_198[0x48] = '\0';
  local_198[0x49] = '\0';
  local_198[0x4a] = '\0';
  local_198[0x4b] = '\0';
  local_198[0x4c] = '\0';
  local_198[0x4d] = '\0';
  local_198[0x4e] = '\0';
  local_198[0x4f] = '\0';
  local_198[0x50] = '\0';
  local_198[0x51] = '\0';
  local_198[0x52] = '\0';
  local_198[0x53] = '\0';
  local_198[0x54] = '\0';
  local_198[0x55] = '\0';
  local_198[0x56] = '\0';
  local_198[0x57] = '\0';
  local_198[0x58] = '\0';
  local_198[0x59] = '\0';
  local_198[0x5a] = '\0';
  local_198[0x5b] = '\0';
  local_198[0x5c] = '\0';
  local_198[0x5d] = '\0';
  local_198[0x5e] = '\0';
  local_198[0x5f] = '\0';
  local_198[0x60] = '\0';
  local_198[0x61] = '\0';
  local_198[0x62] = '\0';
  local_198[99] = '\0';
  local_198[100] = '\0';
  local_198[0x65] = '\0';
  local_198[0x66] = '\0';
  local_198[0x67] = '\0';
  local_198[0x68] = '\0';
  local_198[0x69] = '\0';
  local_198[0x6a] = '\0';
  local_198[0x6b] = '\0';
  local_198[0x6c] = '\0';
  local_198[0x6d] = '\0';
  local_198[0x6e] = '\0';
  local_198[0x6f] = '\0';
  local_198[0x70] = '\0';
  local_198[0x71] = '\0';
  local_198[0x72] = '\0';
  local_198[0x73] = '\0';
  local_198[0x74] = '\0';
  local_198[0x75] = '\0';
  local_198[0x76] = '\0';
  local_198[0x77] = '\0';
  local_198[0x78] = '\0';
  local_198[0x79] = '\0';
  local_198[0x7a] = '\0';
  local_198[0x7b] = '\0';
  local_198[0x7c] = '\0';
  local_198[0x7d] = '\0';
  local_198[0x7e] = '\0';
  local_198[0x7f] = '\0';
  __s = local_198 + 0x80;
  memset(__s,0,0x100);
  getcwd(local_198,0x80);
  sprintf(__s,"%s/%s",local_198,"test.log");
  qc_log_init(__s,8,10,5);
  _qc_info("log test start...");
  uVar1 = 0;
  do {
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x37,1,"test debug(level%d) out =========================================== %d",1,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x38,2,"test debug(level%d) out =========================================== %d",2,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x39,3,"test debug(level%d) out =========================================== %d",3,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3a,4,"test debug(level%d) out =========================================== %d",4,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3b,5,"test debug(level%d) out =========================================== %d",5,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3c,6,"test debug(level%d) out =========================================== %d",6,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3d,7,"test debug(level%d) out =========================================== %d",7,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3e,8,"test debug(level%d) out =========================================== %d",8,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x3f,9,"test debug(level%d) out =========================================== %d",9,
               (ulong)uVar1);
    _qc_pdebug("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/test/test_log.c"
               ,0x40,10,"test debug(level%d) out =========================================== %d",10,
               (ulong)uVar1);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 30000);
  _qc_info("log test stoped!");
  return 0;
}

Assistant:

int test_log()
{
    char cwd[128];
    char logfile[256];

    memset(cwd, 0, sizeof(cwd));
    memset(logfile, 0, sizeof(logfile));

    getcwd(cwd, sizeof(cwd));

    sprintf(logfile, "%s/%s", cwd, "test.log");

    qc_log_init(logfile, 8, 10, 5);

    qc_info("log test start...");

    for(int i=0; i<30000; i++)
    {
        qc_pdebug(1, "test debug(level%d) out =========================================== %d", 1, i);
        qc_pdebug(2, "test debug(level%d) out =========================================== %d", 2, i);
        qc_pdebug(3, "test debug(level%d) out =========================================== %d", 3, i);
        qc_pdebug(4, "test debug(level%d) out =========================================== %d", 4, i);
        qc_pdebug(5, "test debug(level%d) out =========================================== %d", 5, i);
        qc_pdebug(6, "test debug(level%d) out =========================================== %d", 6, i);
        qc_pdebug(7, "test debug(level%d) out =========================================== %d", 7, i);
        qc_pdebug(8, "test debug(level%d) out =========================================== %d", 8, i);
        qc_pdebug(9, "test debug(level%d) out =========================================== %d", 9, i);
        qc_pdebug(10, "test debug(level%d) out =========================================== %d", 10, i);
    }

    qc_info("log test stoped!");

    return 0;
}